

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage_conversions.cpp
# Opt level: O2

void convert_ARGB_PM_to_Indexed8(QImageData *dst,QImageData *src,ImageConversionFlags flags)

{
  QImageData *dest;
  QImageData *oldD;
  long in_FS_OFFSET;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.wd.m_i = src->width;
  local_30.ht.m_i = src->height;
  dest = QImageData::create(&local_30,Format_ARGB32);
  convert_generic(dest,src,(ImageConversionFlags)0x0);
  convert_RGB_to_Indexed8(dst,dest,flags);
  QScopedPointerDeleter<QImageData>::cleanup((EVP_PKEY_CTX *)dest);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void convert_ARGB_PM_to_Indexed8(QImageData *dst, const QImageData *src, Qt::ImageConversionFlags flags)
{
    QScopedPointer<QImageData> tmp(QImageData::create(QSize(src->width, src->height), QImage::Format_ARGB32));
    convert_generic(tmp.data(), src, Qt::AutoColor);
    convert_RGB_to_Indexed8(dst, tmp.data(), flags);
}